

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall btGeneric6DofConstraint::calculateLinearInfo(btGeneric6DofConstraint *this)

{
  btScalar bVar1;
  btTranslationalLimitMotor *this_00;
  btScalar *pbVar2;
  long in_RDI;
  btVector3 bVar3;
  int i;
  btVector3 *in_stack_ffffffffffffff68;
  btScalar in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int limitIndex;
  int local_5c;
  btMatrix3x3 *in_stack_ffffffffffffffd0;
  
  this_00 = (btTranslationalLimitMotor *)btTransform::getOrigin((btTransform *)(in_RDI + 0x480));
  btTransform::getOrigin((btTransform *)(in_RDI + 0x440));
  bVar3 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff68);
  *(long *)(in_RDI + 0x500) = bVar3.m_floats._0_8_;
  *(long *)(in_RDI + 0x508) = bVar3.m_floats._8_8_;
  btTransform::getBasis((btTransform *)(in_RDI + 0x440));
  btMatrix3x3::inverse(in_stack_ffffffffffffffd0);
  bVar3 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
  *(long *)(in_RDI + 0x500) = bVar3.m_floats._0_8_;
  *(long *)(in_RDI + 0x508) = bVar3.m_floats._8_8_;
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x500));
    bVar1 = pbVar2[local_5c];
    pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x360));
    pbVar2[local_5c] = bVar1;
    limitIndex = local_5c;
    btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x500));
    btTranslationalLimitMotor::testLimitValue(this_00,limitIndex,in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::calculateLinearInfo()
{
	m_calculatedLinearDiff = m_calculatedTransformB.getOrigin() - m_calculatedTransformA.getOrigin();
	m_calculatedLinearDiff = m_calculatedTransformA.getBasis().inverse() * m_calculatedLinearDiff;
	for(int i = 0; i < 3; i++)
	{
		m_linearLimits.m_currentLinearDiff[i] = m_calculatedLinearDiff[i];
		m_linearLimits.testLimitValue(i, m_calculatedLinearDiff[i]);
	}
}